

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bake.c
# Opt level: O0

err_t bakeKDF(octet *key,octet *secret,size_t secret_len,octet *iv,size_t iv_len,size_t num)

{
  bool_t bVar1;
  octet *hash;
  size_t sVar2;
  octet *level;
  octet *key_00;
  void *in_RCX;
  size_t in_RDX;
  void *in_RSI;
  void *in_RDI;
  octet *in_R8;
  size_t in_R9;
  octet *block;
  void *state;
  size_t in_stack_ffffffffffffffa8;
  octet *header;
  
  bVar1 = memIsValid(in_RSI,in_RDX);
  if (((bVar1 != 0) && (bVar1 = memIsValid(in_RCX,(size_t)in_R8), bVar1 != 0)) &&
     (bVar1 = memIsValid(in_RDI,0x20), bVar1 != 0)) {
    hash = (octet *)beltHash_keep();
    sVar2 = beltKRP_keep();
    utilMax(2,hash,sVar2 + 0x10);
    level = (octet *)blobCreate(in_stack_ffffffffffffffa8);
    if (level == (octet *)0x0) {
      return 0x6e;
    }
    header = level;
    sVar2 = beltKRP_keep();
    key_00 = level + sVar2;
    beltHashStart(hash);
    beltHashStepH(header,(size_t)key_00,hash);
    beltHashStepH(header,(size_t)key_00,hash);
    beltHashStepG(hash,level);
    memSet(hash,(octet)((ulong)level >> 0x38),0x11b45c);
    beltKRPStart(header,key_00,(size_t)hash,level);
    memCopy(hash,level,0x11b489);
    memSet(hash,(octet)((ulong)level >> 0x38),0x11b49e);
    beltKRPStepG(in_R8,in_R9,header,key_00);
    blobClose((blob_t)0x11b4c1);
    return 0;
  }
  return 0x6d;
}

Assistant:

err_t bakeKDF(octet key[32], const octet secret[], size_t secret_len, 
	const octet iv[], size_t iv_len, size_t num)
{
	void* state;
	octet* block;
	// проверить входные данные
	if (!memIsValid(secret, secret_len) ||
		!memIsValid(iv, iv_len) ||
		!memIsValid(key, 32))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(utilMax(2, beltHash_keep(), beltKRP_keep() + 16));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	block = (octet*)state + beltKRP_keep();
	// key <- beltHash(secret || iv)
	beltHashStart(state);
	beltHashStepH(secret, secret_len, state);
	beltHashStepH(iv, iv_len, state);
	beltHashStepG(key, state);
	// key <- beltKRP(Y, 1^96, num)
	memSet(block, 0xFF, 12);
	beltKRPStart(state, key, 32, block);
	CASSERT(B_PER_S <= 128);
	memCopy(block, &num, sizeof(size_t));
#if (OCTET_ORDER == BIG_ENDIAN)
	memRev(block, sizeof(size_t));
#endif
	memSetZero(block + sizeof(size_t), 16 - sizeof(size_t));
	beltKRPStepG(key, 32, block, state);
	// завершить
	blobClose(state);
	return ERR_OK;
}